

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::~UEFITool(UEFITool *this)

{
  qsizetype *this_00;
  
  this_00 = &this[-1].version.d.size;
  ~UEFITool((UEFITool *)this_00);
  operator_delete(this_00,0x100);
  return;
}

Assistant:

UEFITool::~UEFITool()
{
    delete ffsBuilder;
    delete ffsOps;
    delete ffsFinder;
    delete ffsParser;
    delete ffsReport;
    delete model;
    delete hexViewDialog;
    delete searchDialog;
    delete ui;
}